

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

bool __thiscall
testing::internal::TypedExpectation<void_*(unsigned_long)>::Matches
          (TypedExpectation<void_*(unsigned_long)> *this,ArgumentTuple *args)

{
  MatcherInterface<unsigned_long> *pMVar1;
  MatcherInterface<const_std::tuple<unsigned_long>_&> *pMVar2;
  undefined1 uVar3;
  int iVar4;
  DummyMatchResultListener dummy;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  pMVar1 = (this->matchers_).super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>_>.
           super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
           super_MatcherBase<unsigned_long>.impl_.value_;
  iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,(args->super__Tuple_impl<0UL,_unsigned_long>).
                            super__Head_base<0UL,_unsigned_long,_false>._M_head_impl);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    pMVar2 = (this->extra_matcher_).super_MatcherBase<const_std::tuple<unsigned_long>_&>.impl_.
             value_;
    iVar4 = (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar2,args);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }